

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void icons_to_property(Fl_RGB_Image **icons,int count,unsigned_long **property,size_t *len)

{
  Fl_RGB_Image *this;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong uVar4;
  char **ppcVar5;
  int local_68;
  int local_60;
  int local_5c;
  int x;
  int y;
  uchar *in;
  int extra_data;
  Fl_RGB_Image *image;
  int i_1;
  int i;
  unsigned_long *data;
  size_t sz;
  size_t *len_local;
  unsigned_long **property_local;
  int count_local;
  Fl_RGB_Image **icons_local;
  
  data = (unsigned_long *)0x0;
  for (image._4_4_ = 0; image._4_4_ < count; image._4_4_ = image._4_4_ + 1) {
    iVar2 = Fl_Image::w(&icons[image._4_4_]->super_Fl_Image);
    iVar3 = Fl_Image::h(&icons[image._4_4_]->super_Fl_Image);
    data = (unsigned_long *)((long)(iVar2 * iVar3 + 2) + (long)data);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = data;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  _i_1 = (unsigned_long *)operator_new__(uVar4);
  *property = _i_1;
  *len = (size_t)data;
  for (image._0_4_ = 0; (int)image < count; image._0_4_ = (int)image + 1) {
    this = icons[(int)image];
    iVar2 = Fl_Image::w(&this->super_Fl_Image);
    *_i_1 = (long)iVar2;
    iVar2 = Fl_Image::h(&this->super_Fl_Image);
    _i_1[1] = (long)iVar2;
    _i_1 = _i_1 + 2;
    iVar2 = Fl_Image::ld(&this->super_Fl_Image);
    if (iVar2 == 0) {
      local_68 = 0;
    }
    else {
      local_68 = Fl_Image::ld(&this->super_Fl_Image);
      iVar2 = Fl_Image::w(&this->super_Fl_Image);
      iVar3 = Fl_Image::d(&this->super_Fl_Image);
      local_68 = local_68 - iVar2 * iVar3;
    }
    ppcVar5 = Fl_Image::data(&this->super_Fl_Image);
    _x = (byte *)*ppcVar5;
    for (local_5c = 0; iVar2 = Fl_Image::h(&this->super_Fl_Image), local_5c < iVar2;
        local_5c = local_5c + 1) {
      for (local_60 = 0; iVar2 = Fl_Image::w(&this->super_Fl_Image), local_60 < iVar2;
          local_60 = local_60 + 1) {
        iVar2 = Fl_Image::d(&this->super_Fl_Image);
        switch(iVar2) {
        case 1:
          *_i_1 = (long)(int)((uint)*_x << 0x10 | 0xff000000 | (uint)*_x << 8 | (uint)*_x);
          break;
        case 2:
          *_i_1 = (long)(int)((uint)_x[1] << 0x18 | (uint)*_x << 0x10 | (uint)*_x << 8 | (uint)*_x);
          break;
        case 3:
          *_i_1 = (long)(int)((uint)*_x << 0x10 | 0xff000000 | (uint)_x[1] << 8 | (uint)_x[2]);
          break;
        case 4:
          *_i_1 = (long)(int)((uint)_x[3] << 0x18 | (uint)*_x << 0x10 | (uint)_x[1] << 8 |
                             (uint)_x[2]);
        }
        iVar2 = Fl_Image::d(&this->super_Fl_Image);
        _x = _x + iVar2;
        _i_1 = _i_1 + 1;
      }
      _x = _x + local_68;
    }
  }
  return;
}

Assistant:

static void icons_to_property(const Fl_RGB_Image *icons[], int count,
                              unsigned long **property, size_t *len) {
  size_t sz;
  unsigned long *data;

  sz = 0;
  for (int i = 0;i < count;i++)
    sz += 2 + icons[i]->w() * icons[i]->h();

  // FIXME: Might want to sort the icons

  *property = data = new unsigned long[sz];
  *len = sz;

  for (int i = 0;i < count;i++) {
    const Fl_RGB_Image *image;

    image = icons[i];

    data[0] = image->w();
    data[1] = image->h();
    data += 2;

    const int extra_data = image->ld() ? (image->ld()-image->w()*image->d()) : 0;

    const uchar *in = (const uchar*)*image->data();
    for (int y = 0; y < image->h(); y++) {
      for (int x = 0; x < image->w(); x++) {
        switch (image->d()) {
        case 1:
          *data = ( 0xff<<24) | (in[0]<<16) | (in[0]<<8) | in[0];
          break;
        case 2:
          *data = (in[1]<<24) | (in[0]<<16) | (in[0]<<8) | in[0];
          break;
        case 3:
          *data = ( 0xff<<24) | (in[0]<<16) | (in[1]<<8) | in[2];
          break;
        case 4:
          *data = (in[3]<<24) | (in[0]<<16) | (in[1]<<8) | in[2];
          break;
        }
        in += image->d();
        data++;
      }
      in += extra_data;
    }
  }
}